

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O1

void embree::avx512::
     BVHNIntersector1<8,_1,_false,_embree::avx512::ArrayIntersector1<embree::avx512::TriangleMIntersector1Moeller<4,_true>_>_>
     ::occluded(Intersectors *This,Ray *ray,RayQueryContext *context)

{
  undefined4 uVar1;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar2;
  Geometry *pGVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  bool bVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong unaff_R12;
  size_t mask;
  ulong uVar14;
  long lVar15;
  int iVar16;
  bool bVar17;
  byte bVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [32];
  undefined1 auVar44 [16];
  uint uVar45;
  uint uVar46;
  uint uVar47;
  uint uVar48;
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [64];
  undefined1 auVar52 [64];
  undefined1 auVar53 [64];
  undefined1 auVar54 [64];
  undefined1 auVar55 [64];
  undefined1 auVar56 [64];
  undefined1 auVar57 [64];
  undefined1 auVar58 [64];
  undefined1 auVar59 [64];
  undefined1 auVar60 [64];
  undefined1 in_ZMM29 [64];
  undefined1 auVar61 [64];
  undefined1 auVar62 [64];
  ulong local_1468;
  int local_1444;
  RTCIntersectArguments *local_1440;
  ulong local_1438;
  ulong local_1430;
  ulong local_1428;
  ulong local_1420;
  ulong local_1418;
  ulong local_1410;
  NodeRef *local_1408;
  RayQueryContext *local_1400;
  ulong local_13f8;
  Scene *local_13f0;
  HitK<1> h;
  RTCFilterFunctionNArguments args;
  float local_1338 [4];
  undefined1 local_1328 [16];
  float local_1318 [4];
  undefined1 local_1308 [16];
  undefined1 local_12f8 [16];
  undefined1 local_12e8 [16];
  undefined1 local_12d8 [32];
  undefined1 local_12b8 [32];
  undefined1 local_1298 [32];
  undefined1 local_1278 [32];
  undefined1 local_1258 [32];
  undefined1 local_1238 [32];
  undefined1 local_1218 [32];
  undefined1 local_11f8 [32];
  NodeRef stack [564];
  
  if (*(long *)&This->ptr[1].bounds.bounds0.lower.field_0 != 8) {
    if (0.0 <= ray->tfar) {
      local_1408 = stack + 1;
      aVar2 = (ray->dir).field_0.field_1;
      auVar22 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->org).field_0.m128[3]));
      auVar19._8_4_ = 0x7fffffff;
      auVar19._0_8_ = 0x7fffffff7fffffff;
      auVar19._12_4_ = 0x7fffffff;
      auVar19 = vandps_avx512vl((undefined1  [16])aVar2,auVar19);
      auVar40._8_4_ = 0x219392ef;
      auVar40._0_8_ = 0x219392ef219392ef;
      auVar40._12_4_ = 0x219392ef;
      uVar14 = vcmpps_avx512vl(auVar19,auVar40,1);
      bVar17 = (bool)((byte)uVar14 & 1);
      auVar20._0_4_ = (uint)bVar17 * 0x219392ef | (uint)!bVar17 * (int)aVar2.x;
      bVar17 = (bool)((byte)(uVar14 >> 1) & 1);
      auVar20._4_4_ = (uint)bVar17 * 0x219392ef | (uint)!bVar17 * (int)aVar2.y;
      bVar17 = (bool)((byte)(uVar14 >> 2) & 1);
      auVar20._8_4_ = (uint)bVar17 * 0x219392ef | (uint)!bVar17 * (int)aVar2.z;
      bVar17 = (bool)((byte)(uVar14 >> 3) & 1);
      auVar20._12_4_ = (uint)bVar17 * 0x219392ef | (uint)!bVar17 * aVar2.field_3.a;
      auVar19 = vrcp14ps_avx512vl(auVar20);
      auVar21._8_4_ = 0x3f800000;
      auVar21._0_8_ = &DAT_3f8000003f800000;
      auVar21._12_4_ = 0x3f800000;
      auVar21 = vfnmadd213ps_avx512vl(auVar20,auVar19,auVar21);
      stack[0].ptr = *(size_t *)&This->ptr[1].bounds.bounds0.lower.field_0;
      auVar20 = vfmadd132ps_fma(auVar21,auVar19,auVar19);
      auVar31 = vbroadcastss_avx512vl(auVar20);
      auVar51 = ZEXT3264(auVar31);
      auVar19 = vmovshdup_avx(auVar20);
      auVar31 = vbroadcastsd_avx512vl(auVar19);
      auVar52 = ZEXT3264(auVar31);
      auVar21 = vshufpd_avx(auVar20,auVar20,1);
      auVar32._8_4_ = 2;
      auVar32._0_8_ = 0x200000002;
      auVar32._12_4_ = 2;
      auVar32._16_4_ = 2;
      auVar32._20_4_ = 2;
      auVar32._24_4_ = 2;
      auVar32._28_4_ = 2;
      auVar31 = vpermps_avx512vl(auVar32,ZEXT1632(auVar20));
      auVar53 = ZEXT3264(auVar31);
      fVar35 = auVar20._0_4_ * (ray->org).field_0.m128[0];
      auVar43._4_4_ = fVar35;
      auVar43._0_4_ = fVar35;
      auVar43._8_4_ = fVar35;
      auVar43._12_4_ = fVar35;
      auVar43._16_4_ = fVar35;
      auVar43._20_4_ = fVar35;
      auVar43._24_4_ = fVar35;
      auVar43._28_4_ = fVar35;
      auVar31._8_4_ = 1;
      auVar31._0_8_ = 0x100000001;
      auVar31._12_4_ = 1;
      auVar31._16_4_ = 1;
      auVar31._20_4_ = 1;
      auVar31._24_4_ = 1;
      auVar31._28_4_ = 1;
      auVar33 = ZEXT1632(CONCAT412(auVar20._12_4_ * (ray->org).field_0.m128[3],
                                   CONCAT48(auVar20._8_4_ * (ray->org).field_0.m128[2],
                                            CONCAT44(auVar20._4_4_ * (ray->org).field_0.m128[1],
                                                     fVar35))));
      auVar31 = vpermps_avx2(auVar31,auVar33);
      auVar33 = vpermps_avx2(auVar32,auVar33);
      local_1410 = (ulong)(auVar20._0_4_ < 0.0) << 5;
      local_1418 = (ulong)(auVar19._0_4_ < 0.0) << 5 | 0x40;
      local_1420 = (ulong)(auVar21._0_4_ < 0.0) << 5 | 0x80;
      local_1428 = local_1410 ^ 0x20;
      local_1430 = local_1418 ^ 0x20;
      uVar14 = local_1420 ^ 0x20;
      auVar34._8_4_ = 0x80000000;
      auVar34._0_8_ = 0x8000000080000000;
      auVar34._12_4_ = 0x80000000;
      auVar34._16_4_ = 0x80000000;
      auVar34._20_4_ = 0x80000000;
      auVar34._24_4_ = 0x80000000;
      auVar34._28_4_ = 0x80000000;
      auVar32 = vxorps_avx512vl(auVar43,auVar34);
      auVar54 = ZEXT3264(auVar32);
      auVar31 = vxorps_avx512vl(auVar31,auVar34);
      auVar55 = ZEXT3264(auVar31);
      auVar31 = vxorps_avx512vl(auVar33,auVar34);
      auVar56 = ZEXT3264(auVar31);
      auVar31 = vbroadcastss_avx512vl(auVar22);
      auVar57 = ZEXT3264(auVar31);
      auVar31 = vbroadcastss_avx512vl(ZEXT416((uint)ray->tfar));
      auVar58 = ZEXT3264(auVar31);
      auVar22 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      auVar59 = ZEXT1664(auVar22);
      auVar22 = vmovddup_avx512vl(ZEXT816(0x8000000080000000));
      auVar60 = ZEXT1664(auVar22);
      auVar22 = vxorps_avx512vl(in_ZMM29._0_16_,in_ZMM29._0_16_);
      auVar61 = ZEXT1664(auVar22);
      auVar22 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
      auVar62 = ZEXT1664(auVar22);
      local_1400 = context;
      local_1438 = uVar14;
      do {
        if (local_1408 == stack) {
          return;
        }
        uVar13 = local_1408[-1].ptr;
        local_1408 = local_1408 + -1;
        do {
          if ((uVar13 & 8) == 0) {
            auVar31 = vfmadd132ps_avx512vl
                                (*(undefined1 (*) [32])(uVar13 + 0x40 + local_1410),auVar54._0_32_,
                                 auVar51._0_32_);
            auVar33 = vfmadd132ps_avx512vl
                                (*(undefined1 (*) [32])(uVar13 + 0x40 + local_1418),auVar55._0_32_,
                                 auVar52._0_32_);
            auVar31 = vpmaxsd_avx2(auVar31,auVar33);
            auVar33 = vfmadd132ps_avx512vl
                                (*(undefined1 (*) [32])(uVar13 + 0x40 + local_1420),auVar56._0_32_,
                                 auVar53._0_32_);
            auVar33 = vpmaxsd_avx512vl(auVar33,auVar57._0_32_);
            auVar31 = vpmaxsd_avx2(auVar31,auVar33);
            auVar33 = vfmadd132ps_avx512vl
                                (*(undefined1 (*) [32])(uVar13 + 0x40 + local_1428),auVar54._0_32_,
                                 auVar51._0_32_);
            auVar32 = vfmadd132ps_avx512vl
                                (*(undefined1 (*) [32])(uVar13 + 0x40 + local_1430),auVar55._0_32_,
                                 auVar52._0_32_);
            auVar33 = vpminsd_avx2(auVar33,auVar32);
            auVar32 = vfmadd132ps_avx512vl
                                (*(undefined1 (*) [32])(uVar13 + 0x40 + uVar14),auVar56._0_32_,
                                 auVar53._0_32_);
            auVar32 = vpminsd_avx512vl(auVar32,auVar58._0_32_);
            auVar33 = vpminsd_avx2(auVar33,auVar32);
            uVar7 = vpcmpd_avx512vl(auVar31,auVar33,2);
            unaff_R12 = CONCAT44((int)(unaff_R12 >> 0x20),(uint)(byte)uVar7);
          }
          if ((uVar13 & 8) == 0) {
            if (unaff_R12 == 0) {
              iVar16 = 4;
            }
            else {
              uVar12 = uVar13 & 0xfffffffffffffff0;
              lVar15 = 0;
              for (uVar13 = unaff_R12; (uVar13 & 1) == 0; uVar13 = uVar13 >> 1 | 0x8000000000000000)
              {
                lVar15 = lVar15 + 1;
              }
              iVar16 = 0;
              for (uVar11 = unaff_R12 - 1 & unaff_R12; uVar13 = *(ulong *)(uVar12 + lVar15 * 8),
                  uVar11 != 0; uVar11 = uVar11 - 1 & uVar11) {
                local_1408->ptr = uVar13;
                local_1408 = local_1408 + 1;
                lVar15 = 0;
                for (uVar13 = uVar11; (uVar13 & 1) == 0; uVar13 = uVar13 >> 1 | 0x8000000000000000)
                {
                  lVar15 = lVar15 + 1;
                }
              }
            }
          }
          else {
            iVar16 = 6;
          }
        } while (iVar16 == 0);
        if (iVar16 == 6) {
          local_13f8 = (ulong)((uint)uVar13 & 0xf) - 8;
          bVar17 = local_13f8 != 0;
          if (bVar17) {
            uVar13 = uVar13 & 0xfffffffffffffff0;
            uVar12 = 0;
            do {
              lVar15 = uVar12 * 0xb0;
              auVar22 = *(undefined1 (*) [16])(uVar13 + 0x80 + lVar15);
              auVar19 = *(undefined1 (*) [16])(uVar13 + 0x40 + lVar15);
              auVar21 = *(undefined1 (*) [16])(uVar13 + 0x70 + lVar15);
              auVar20 = *(undefined1 (*) [16])(uVar13 + 0x50 + lVar15);
              auVar23._0_4_ = auVar19._0_4_ * auVar22._0_4_;
              auVar23._4_4_ = auVar19._4_4_ * auVar22._4_4_;
              auVar23._8_4_ = auVar19._8_4_ * auVar22._8_4_;
              auVar23._12_4_ = auVar19._12_4_ * auVar22._12_4_;
              auVar40 = *(undefined1 (*) [16])(uVar13 + 0x60 + lVar15);
              auVar44 = *(undefined1 (*) [16])(uVar13 + 0x30 + lVar15);
              local_1308 = vfmsub231ps_fma(auVar23,auVar21,auVar20);
              auVar27._0_4_ = auVar20._0_4_ * auVar40._0_4_;
              auVar27._4_4_ = auVar20._4_4_ * auVar40._4_4_;
              auVar27._8_4_ = auVar20._8_4_ * auVar40._8_4_;
              auVar27._12_4_ = auVar20._12_4_ * auVar40._12_4_;
              local_12f8 = vfmsub231ps_fma(auVar27,auVar22,auVar44);
              auVar28._0_4_ = auVar44._0_4_ * auVar21._0_4_;
              auVar28._4_4_ = auVar44._4_4_ * auVar21._4_4_;
              auVar28._8_4_ = auVar44._8_4_ * auVar21._8_4_;
              auVar28._12_4_ = auVar44._12_4_ * auVar21._12_4_;
              uVar1 = *(undefined4 *)&(ray->dir).field_0;
              auVar30._4_4_ = uVar1;
              auVar30._0_4_ = uVar1;
              auVar30._8_4_ = uVar1;
              auVar30._12_4_ = uVar1;
              uVar1 = *(undefined4 *)((long)&(ray->dir).field_0 + 4);
              auVar49._4_4_ = uVar1;
              auVar49._0_4_ = uVar1;
              auVar49._8_4_ = uVar1;
              auVar49._12_4_ = uVar1;
              fVar35 = (ray->dir).field_0.m128[2];
              auVar29._4_4_ = fVar35;
              auVar29._0_4_ = fVar35;
              auVar29._8_4_ = fVar35;
              auVar29._12_4_ = fVar35;
              uVar1 = *(undefined4 *)&(ray->org).field_0;
              auVar26._4_4_ = uVar1;
              auVar26._0_4_ = uVar1;
              auVar26._8_4_ = uVar1;
              auVar26._12_4_ = uVar1;
              auVar23 = vsubps_avx512vl(*(undefined1 (*) [16])(uVar13 + lVar15),auVar26);
              local_12e8 = vfmsub231ps_fma(auVar28,auVar40,auVar19);
              uVar1 = *(undefined4 *)((long)&(ray->org).field_0 + 4);
              auVar24._4_4_ = uVar1;
              auVar24._0_4_ = uVar1;
              auVar24._8_4_ = uVar1;
              auVar24._12_4_ = uVar1;
              auVar24 = vsubps_avx512vl(*(undefined1 (*) [16])(uVar13 + 0x10 + lVar15),auVar24);
              uVar1 = *(undefined4 *)((long)&(ray->org).field_0 + 8);
              auVar25._4_4_ = uVar1;
              auVar25._0_4_ = uVar1;
              auVar25._8_4_ = uVar1;
              auVar25._12_4_ = uVar1;
              auVar25 = vsubps_avx512vl(*(undefined1 (*) [16])(uVar13 + 0x20 + lVar15),auVar25);
              auVar26 = vmulps_avx512vl(auVar49,auVar25);
              auVar27 = vfmsub231ps_avx512vl(auVar26,auVar24,auVar29);
              auVar26 = vmulps_avx512vl(auVar29,auVar23);
              auVar28 = vfmsub231ps_avx512vl(auVar26,auVar25,auVar30);
              auVar26 = vmulps_avx512vl(auVar30,auVar24);
              auVar29 = vfmsub231ps_avx512vl(auVar26,auVar23,auVar49);
              auVar50._0_4_ = fVar35 * local_12e8._0_4_;
              auVar50._4_4_ = fVar35 * local_12e8._4_4_;
              auVar50._8_4_ = fVar35 * local_12e8._8_4_;
              auVar50._12_4_ = fVar35 * local_12e8._12_4_;
              auVar26 = vfmadd231ps_fma(auVar50,local_12f8,auVar49);
              auVar26 = vfmadd231ps_fma(auVar26,local_1308,auVar30);
              auVar30 = vandps_avx512vl(auVar26,auVar59._0_16_);
              auVar22 = vmulps_avx512vl(auVar22,auVar29);
              auVar22 = vfmadd231ps_avx512vl(auVar22,auVar28,auVar21);
              auVar22 = vfmadd231ps_avx512vl(auVar22,auVar27,auVar40);
              auVar21 = vandps_avx512vl(auVar26,auVar60._0_16_);
              uVar45 = auVar21._0_4_;
              auVar42._0_4_ = (float)(uVar45 ^ auVar22._0_4_);
              uVar46 = auVar21._4_4_;
              auVar42._4_4_ = (float)(uVar46 ^ auVar22._4_4_);
              uVar47 = auVar21._8_4_;
              auVar42._8_4_ = (float)(uVar47 ^ auVar22._8_4_);
              uVar48 = auVar21._12_4_;
              auVar42._12_4_ = (float)(uVar48 ^ auVar22._12_4_);
              auVar22 = vmulps_avx512vl(auVar20,auVar29);
              auVar22 = vfmadd231ps_avx512vl(auVar22,auVar19,auVar28);
              auVar22 = vfmadd231ps_avx512vl(auVar22,auVar44,auVar27);
              auVar44._0_4_ = (float)(uVar45 ^ auVar22._0_4_);
              auVar44._4_4_ = (float)(uVar46 ^ auVar22._4_4_);
              auVar44._8_4_ = (float)(uVar47 ^ auVar22._8_4_);
              auVar44._12_4_ = (float)(uVar48 ^ auVar22._12_4_);
              auVar22 = auVar61._0_16_;
              uVar7 = vcmpps_avx512vl(auVar42,auVar22,5);
              uVar4 = vcmpps_avx512vl(auVar44,auVar22,5);
              uVar5 = vcmpps_avx512vl(auVar26,auVar22,4);
              auVar22._0_4_ = auVar44._0_4_ + auVar42._0_4_;
              auVar22._4_4_ = auVar44._4_4_ + auVar42._4_4_;
              auVar22._8_4_ = auVar44._8_4_ + auVar42._8_4_;
              auVar22._12_4_ = auVar44._12_4_ + auVar42._12_4_;
              uVar6 = vcmpps_avx512vl(auVar22,auVar30,2);
              bVar18 = (byte)uVar7 & (byte)uVar4 & (byte)uVar5 & (byte)uVar6;
              if (bVar18 != 0) {
                auVar41._0_4_ = local_12e8._0_4_ * auVar25._0_4_;
                auVar41._4_4_ = local_12e8._4_4_ * auVar25._4_4_;
                auVar41._8_4_ = local_12e8._8_4_ * auVar25._8_4_;
                auVar41._12_4_ = local_12e8._12_4_ * auVar25._12_4_;
                auVar22 = vfmadd213ps_fma(auVar24,local_12f8,auVar41);
                auVar22 = vfmadd213ps_fma(auVar23,local_1308,auVar22);
                auVar39._0_4_ = (float)(uVar45 ^ auVar22._0_4_);
                auVar39._4_4_ = (float)(uVar46 ^ auVar22._4_4_);
                auVar39._8_4_ = (float)(uVar47 ^ auVar22._8_4_);
                auVar39._12_4_ = (float)(uVar48 ^ auVar22._12_4_);
                uVar1 = *(undefined4 *)((long)&(ray->org).field_0 + 0xc);
                auVar8._4_4_ = uVar1;
                auVar8._0_4_ = uVar1;
                auVar8._8_4_ = uVar1;
                auVar8._12_4_ = uVar1;
                auVar22 = vmulps_avx512vl(auVar30,auVar8);
                fVar35 = ray->tfar;
                auVar9._4_4_ = fVar35;
                auVar9._0_4_ = fVar35;
                auVar9._8_4_ = fVar35;
                auVar9._12_4_ = fVar35;
                auVar19 = vmulps_avx512vl(auVar30,auVar9);
                uVar7 = vcmpps_avx512vl(auVar39,auVar19,2);
                uVar4 = vcmpps_avx512vl(auVar22,auVar39,1);
                bVar18 = (byte)uVar7 & (byte)uVar4 & bVar18;
                if (bVar18 != 0) {
                  auVar22 = vrcp14ps_avx512vl(auVar30);
                  auVar19 = vfnmadd213ps_avx512vl(auVar30,auVar22,auVar62._0_16_);
                  auVar22 = vfmadd132ps_fma(auVar19,auVar22,auVar22);
                  fVar35 = auVar22._0_4_;
                  fVar36 = auVar22._4_4_;
                  fVar37 = auVar22._8_4_;
                  fVar38 = auVar22._12_4_;
                  local_1318[0] = fVar35 * auVar39._0_4_;
                  local_1318[1] = fVar36 * auVar39._4_4_;
                  local_1318[2] = fVar37 * auVar39._8_4_;
                  local_1318[3] = fVar38 * auVar39._12_4_;
                  local_1338[0] = fVar35 * auVar42._0_4_;
                  local_1338[1] = fVar36 * auVar42._4_4_;
                  local_1338[2] = fVar37 * auVar42._8_4_;
                  local_1338[3] = fVar38 * auVar42._12_4_;
                  local_13f0 = local_1400->scene;
                  local_1328._0_4_ = fVar35 * auVar44._0_4_;
                  local_1328._4_4_ = fVar36 * auVar44._4_4_;
                  local_1328._8_4_ = fVar37 * auVar44._8_4_;
                  local_1328._12_4_ = fVar38 * auVar44._12_4_;
                  local_1468 = (ulong)bVar18;
                  do {
                    auVar22 = auVar61._0_16_;
                    uVar14 = 0;
                    for (uVar11 = local_1468; (uVar11 & 1) == 0;
                        uVar11 = uVar11 >> 1 | 0x8000000000000000) {
                      uVar14 = uVar14 + 1;
                    }
                    h.geomID = *(uint *)(lVar15 + uVar13 + 0x90 + uVar14 * 4);
                    pGVar3 = (local_13f0->geometries).items[h.geomID].ptr;
                    if ((pGVar3->mask & ray->mask) == 0) {
                      local_1468 = local_1468 ^ 1L << (uVar14 & 0x3f);
                      bVar10 = true;
                    }
                    else {
                      local_1440 = local_1400->args;
                      if ((local_1440->filter == (RTCFilterFunctionN)0x0) &&
                         (pGVar3->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
                        bVar10 = false;
                      }
                      else {
                        local_12d8 = auVar58._0_32_;
                        local_12b8 = auVar57._0_32_;
                        local_1298 = auVar56._0_32_;
                        local_1278 = auVar55._0_32_;
                        local_1258 = auVar54._0_32_;
                        local_1238 = auVar53._0_32_;
                        local_1218 = auVar52._0_32_;
                        local_11f8 = auVar51._0_32_;
                        uVar11 = (ulong)(uint)((int)uVar14 * 4);
                        h.u = *(float *)((long)local_1338 + uVar11);
                        h.v = *(float *)(local_1328 + uVar11);
                        args.context = local_1400->user;
                        h.primID = *(uint *)(lVar15 + uVar13 + 0xa0 + uVar11);
                        h.Ng.field_0.field_0.x = (float)*(undefined4 *)(local_1308 + uVar11);
                        h.Ng.field_0.field_0.y = (float)*(undefined4 *)(local_12f8 + uVar11);
                        h.Ng.field_0.field_0.z = (float)*(undefined4 *)(local_12e8 + uVar11);
                        h.instID[0] = (args.context)->instID[0];
                        h.instPrimID[0] = (args.context)->instPrimID[0];
                        fVar35 = ray->tfar;
                        ray->tfar = *(float *)((long)local_1318 + uVar11);
                        local_1444 = -1;
                        args.valid = &local_1444;
                        args.geometryUserPtr = pGVar3->userPtr;
                        args.hit = (RTCHitN *)&h;
                        args.N = 1;
                        args.ray = (RTCRayN *)ray;
                        if ((pGVar3->occlusionFilterN == (RTCFilterFunctionN)0x0) ||
                           ((*pGVar3->occlusionFilterN)(&args), *args.valid != 0)) {
                          if (local_1440->filter != (RTCFilterFunctionN)0x0) {
                            if (((local_1440->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                                 RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                               (((pGVar3->field_8).field_0x2 & 0x40) != 0)) {
                              (*local_1440->filter)(&args);
                            }
                            if (*args.valid == 0) goto LAB_00721746;
                          }
                          bVar10 = false;
                        }
                        else {
LAB_00721746:
                          ray->tfar = fVar35;
                          local_1468 = local_1468 ^ 1L << (uVar14 & 0x3f);
                          bVar10 = true;
                        }
                        auVar51 = ZEXT3264(local_11f8);
                        auVar52 = ZEXT3264(local_1218);
                        auVar53 = ZEXT3264(local_1238);
                        auVar54 = ZEXT3264(local_1258);
                        auVar55 = ZEXT3264(local_1278);
                        auVar56 = ZEXT3264(local_1298);
                        auVar57 = ZEXT3264(local_12b8);
                        auVar58 = ZEXT3264(local_12d8);
                        auVar19 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                        auVar59 = ZEXT1664(auVar19);
                        auVar19 = vmovddup_avx512vl(ZEXT816(0x8000000080000000));
                        auVar60 = ZEXT1664(auVar19);
                        auVar22 = vxorps_avx512vl(auVar22,auVar22);
                        auVar61 = ZEXT1664(auVar22);
                        auVar22 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                        auVar62 = ZEXT1664(auVar22);
                      }
                    }
                    if (!bVar10) {
                      iVar16 = 0;
                      uVar14 = local_1438;
                      if (bVar17) {
                        ray->tfar = -INFINITY;
                        iVar16 = 3;
                      }
                      goto LAB_0072181d;
                    }
                  } while (local_1468 != 0);
                }
              }
              uVar12 = uVar12 + 1;
              bVar17 = uVar12 < local_13f8;
              uVar14 = local_1438;
            } while (uVar12 != local_13f8);
          }
          iVar16 = 0;
        }
LAB_0072181d:
      } while (iVar16 != 3);
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::occluded(const Accel::Intersectors* __restrict__ This,
                                                                             Ray& __restrict__ ray,
                                                                             RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
       
      /* early out for already occluded rays */
      if (unlikely(ray.tfar < 0.0f))
        return;

      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      NodeRef stack[stackSize];    // stack of nodes that still need to get traversed
      NodeRef* stackPtr = stack+1; // current stack pointer
      NodeRef* stackEnd = stack+stackSize;
      stack[0] = bvh->root;

      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif

      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = (NodeRef)*stackPtr;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(shadow.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(shadow.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        if (PrimitiveIntersector1::occluded(This, pre, ray, context, prim, num, tray, lazy_node)) {
          ray.tfar = neg_inf;
          break;
        }

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          *stackPtr = (NodeRef)lazy_node;
          stackPtr++;
        }
      }
    }